

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

void duckdb_parquet::swap(ColumnIndex *a,ColumnIndex *b)

{
  _ColumnIndex__isset _Var1;
  type tVar2;
  
  std::swap<duckdb::vector<bool,true>>(&a->null_pages,&b->null_pages);
  std::swap<duckdb::vector<std::__cxx11::string,true>>(&a->min_values,&b->min_values);
  std::swap<duckdb::vector<std::__cxx11::string,true>>(&a->max_values,&b->max_values);
  tVar2 = a->boundary_order;
  a->boundary_order = b->boundary_order;
  b->boundary_order = tVar2;
  std::swap<duckdb::vector<long,true>>(&a->null_counts,&b->null_counts);
  std::swap<duckdb::vector<long,true>>
            (&a->repetition_level_histograms,&b->repetition_level_histograms);
  std::swap<duckdb::vector<long,true>>
            (&a->definition_level_histograms,&b->definition_level_histograms);
  _Var1 = a->__isset;
  a->__isset = b->__isset;
  b->__isset = _Var1;
  return;
}

Assistant:

void swap(ColumnIndex &a, ColumnIndex &b) {
  using ::std::swap;
  swap(a.null_pages, b.null_pages);
  swap(a.min_values, b.min_values);
  swap(a.max_values, b.max_values);
  swap(a.boundary_order, b.boundary_order);
  swap(a.null_counts, b.null_counts);
  swap(a.repetition_level_histograms, b.repetition_level_histograms);
  swap(a.definition_level_histograms, b.definition_level_histograms);
  swap(a.__isset, b.__isset);
}